

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFileListGeneratorEnumerate::Search
          (cmFileListGeneratorEnumerate *this,string *parent,cmFileList *lister)

{
  bool bVar1;
  pointer __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = (this->Vector->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__rhs == (this->Vector->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = false;
  }
  else {
    do {
      std::operator+(&local_50,parent,__rhs);
      bVar1 = cmFileListGeneratorBase::Consider
                        (&this->super_cmFileListGeneratorBase,&local_50,lister);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while ((!bVar1) &&
            (__rhs = __rhs + 1,
            __rhs != (this->Vector->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish));
  }
  return bVar1;
}

Assistant:

virtual bool Search(std::string const& parent, cmFileList& lister)
    {
    for(std::vector<std::string>::const_iterator i = this->Vector.begin();
        i != this->Vector.end(); ++i)
      {
      if(this->Consider(parent + *i, lister))
        {
        return true;
        }
      }
    return false;
    }